

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O3

QAbstractItemView * __thiscall QColumnView::createColumn(QColumnView *this,QModelIndex *index)

{
  char cVar1;
  QListView *this_00;
  QWidget *parent;
  QAbstractItemModel *pQVar2;
  
  this_00 = (QListView *)operator_new(0x28);
  parent = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
  QListView::QListView(this_00,parent);
  initializeColumn(this,(QAbstractItemView *)this_00);
  (**(code **)(*(long *)&(this_00->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                         super_QWidget + 0x218))(this_00,index);
  pQVar2 = QAbstractItemView::model((QAbstractItemView *)this);
  cVar1 = (**(code **)(*(long *)pQVar2 + 0x130))(pQVar2,index);
  if (cVar1 != '\0') {
    pQVar2 = QAbstractItemView::model((QAbstractItemView *)this);
    (**(code **)(*(long *)pQVar2 + 0x128))(pQVar2,index);
  }
  return &this_00->super_QAbstractItemView;
}

Assistant:

QAbstractItemView *QColumnView::createColumn(const QModelIndex &index)
{
    QListView *view = new QListView(viewport());

    initializeColumn(view);

    view->setRootIndex(index);
    if (model()->canFetchMore(index))
        model()->fetchMore(index);

    return view;
}